

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.c
# Opt level: O0

char * val_type(byte typeID)

{
  char *pcStack_10;
  byte typeID_local;
  
  switch(typeID) {
  case '|':
    pcStack_10 = "f64";
    break;
  case '}':
    pcStack_10 = "f32";
    break;
  case '~':
    pcStack_10 = "i64";
    break;
  case '\x7f':
    pcStack_10 = "i32";
    break;
  default:
    fprintf(_stderr,"\nwrong typeID\n");
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/Kingdo777[P]WCasm/cmd/wcasm-objdump/print.c"
                  ,0x6f,"const char *val_type(byte)");
  }
  return pcStack_10;
}

Assistant:

const char *val_type(byte typeID) {
    switch (typeID) {
        case I32:
            return "i32";
        case I64:
            return "i64";
        case F32:
            return "f32";
        case F64:
            return "f64";
        default:
            errorExit("\nwrong typeID\n");
    }
}